

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::evalDefinition(Kvm *this,Value *v,Value *env)

{
  Value *var;
  undefined1 local_40 [8];
  GcGuard guard;
  Value *result;
  Value *env_local;
  Value *v_local;
  Kvm *this_local;
  
  guard.times_ = 0;
  GcGuard::GcGuard((GcGuard *)local_40,&this->gc_);
  GcGuard::pushLocalStackRoot((GcGuard *)local_40,(Value **)&guard.times_);
  guard.times_ = (long)definitionValue(this,v);
  guard.times_ = (long)eval(this,(Value *)guard.times_,env);
  if ((Value *)guard.times_ == (Value *)0x0) {
    this_local = (Kvm *)0x0;
  }
  else {
    var = definitionVariable(this,v);
    defineVariable(this,var,(Value *)guard.times_,env);
    this_local = (Kvm *)this->OK;
  }
  GcGuard::~GcGuard((GcGuard *)local_40);
  return (Value *)this_local;
}

Assistant:

const Value* Kvm::evalDefinition(const Value *v, const Value *env)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = definitionValue(v);
    result = eval(result, env);
    if (!result) return nullptr;
    defineVariable(definitionVariable(v), result, env);
    return OK;
}